

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O2

bool __thiscall KDReports::ReportPrivate::skipHeadersFooters(ReportPrivate *this)

{
  QDebug QStack_38;
  qreal local_30;
  undefined8 local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_30 = rawMainTextDocHeight(this);
  if (local_30 <= 0.0) {
    local_28 = 0x9400000002;
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
    ;
    local_18 = "bool KDReports::ReportPrivate::skipHeadersFooters() const";
    local_10 = "default";
    QMessageLogger::debug();
    QDebug::operator<<(&QStack_38,
                       "Not enough height for headers and footers in this page size, hiding headers and footers."
                      );
    QDebug::~QDebug(&QStack_38);
  }
  return local_30 <= 0.0;
}

Assistant:

bool KDReports::ReportPrivate::skipHeadersFooters() const
{
    const bool skip = rawMainTextDocHeight() <= 0;
    if (skip) {
        qDebug() << "Not enough height for headers and footers in this page size, hiding headers and footers.";
    }
    return skip;
}